

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * str_cpynextword(char *dst,char *src,size_t len)

{
  char *pcVar1;
  ushort **ppuVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  
  if (src == (char *)0x0) {
    *dst = '\0';
    pcVar6 = (char *)0x0;
  }
  else {
    ppuVar2 = __ctype_b_loc();
    pcVar6 = src + -2;
    do {
      uVar4 = (ulong)pcVar6[2];
      pcVar6 = pcVar6 + 1;
    } while (((*ppuVar2)[uVar4] & 1) != 0);
    for (uVar5 = 0;
        ((cVar3 = (char)uVar4, cVar3 != '\0' && (((*ppuVar2)[cVar3] & 1) == 0)) && (uVar5 < len - 1)
        ); uVar5 = uVar5 + 1) {
      dst[uVar5] = cVar3;
      uVar4 = (ulong)(byte)pcVar6[2];
      pcVar6 = pcVar6 + 1;
    }
    dst[uVar5] = '\0';
    do {
      pcVar1 = pcVar6 + 1;
      pcVar6 = pcVar6 + 1;
    } while (((*ppuVar2)[*pcVar1] & 1) != 0);
    if (*pcVar1 == '\0') {
      pcVar6 = (char *)0x0;
    }
  }
  return pcVar6;
}

Assistant:

const char *
str_cpynextword(char *dst, const char *src, size_t len) {
  size_t i;

  /* sanity check */
  if (src == NULL) {
    *dst = 0;
    return NULL;
  }

  /* skip whitespace prefix */
  while (isblank(*src)) {
    src++;
  }

  /* copy next word */
  i = 0;
  while (*src != 0 && !isblank(*src) && i < len - 1) {
    dst[i++] = *src++;
  }

  /* terminate */
  dst[i] = 0;

  /* skip ahead in src */
  while (isblank(*src)) {
    src++;
  }

  if (*src) {
    /* return next word */
    return src;
  }

  /* end of src */
  return NULL;
}